

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warm_cb.cc
# Opt level: O1

void learn_sup_adf<false>(warm_cb *data,example *ec,int ec_type)

{
  uint64_t *puVar1;
  label_t *plVar2;
  undefined8 *puVar3;
  float fVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  label *plVar8;
  example *peVar9;
  pointer ppeVar10;
  label_t lVar11;
  label_t lVar12;
  size_t sVar13;
  long lVar14;
  multi_learner *pmVar15;
  pointer ppeVar16;
  ulong uVar17;
  ulong uVar18;
  float *__args;
  multi_ex *__range1;
  float fVar19;
  vector<float,_std::allocator<float>_> old_weights;
  void *local_48;
  iterator iStack_40;
  float *local_38;
  
  copy_example_to_adf(data,ec);
  if (data->num_actions != 0) {
    lVar14 = 0;
    uVar17 = 0;
    do {
      uVar17 = uVar17 + 1;
      *(uint32_t *)(*(long *)((long)&(data->csls->costs)._begin + lVar14) + 4) = (uint32_t)uVar17;
      **(float **)((long)&(data->csls->costs)._begin + lVar14) =
           (&data->loss0)[(uint32_t)uVar17 != (ec->l).multi.label];
      lVar14 = lVar14 + 0x20;
    } while (uVar17 < data->num_actions);
  }
  if (data->num_actions != 0) {
    lVar14 = 0;
    uVar17 = 0;
    do {
      plVar8 = data->cbls;
      peVar9 = (data->ecs).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
               super__Vector_impl_data._M_start[uVar17];
      lVar11 = (peVar9->l).multi;
      lVar12 = *(label_t *)&(peVar9->l).cs.costs._end;
      sVar13 = (peVar9->l).cs.costs.erase_count;
      puVar3 = (undefined8 *)((long)&(plVar8->costs).end_array + lVar14);
      *puVar3 = (peVar9->l).cs.costs.end_array;
      puVar3[1] = sVar13;
      plVar2 = (label_t *)((long)&(plVar8->costs)._begin + lVar14);
      *plVar2 = lVar11;
      plVar2[1] = lVar12;
      peVar9 = (data->ecs).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
               super__Vector_impl_data._M_start[uVar17];
      plVar2 = (label_t *)((long)&(data->csls->costs)._begin + lVar14);
      lVar11 = *plVar2;
      lVar12 = plVar2[1];
      puVar3 = (undefined8 *)((long)&(data->csls->costs).end_array + lVar14);
      sVar13 = puVar3[1];
      (peVar9->l).cs.costs.end_array = (wclass *)*puVar3;
      (peVar9->l).cs.costs.erase_count = sVar13;
      (peVar9->l).multi = lVar11;
      *(label_t *)&(peVar9->l).cs.costs._end = lVar12;
      uVar17 = uVar17 + 1;
      lVar14 = lVar14 + 0x20;
    } while (uVar17 < data->num_actions);
  }
  local_48 = (void *)0x0;
  iStack_40._M_current = (float *)0x0;
  local_38 = (float *)0x0;
  if (data->num_actions != 0) {
    uVar17 = 0;
    do {
      __args = &(data->ecs).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                super__Vector_impl_data._M_start[uVar17]->weight;
      if (iStack_40._M_current == local_38) {
        std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                  ((vector<float,std::allocator<float>> *)&local_48,iStack_40,__args);
      }
      else {
        *iStack_40._M_current = *__args;
        iStack_40._M_current = iStack_40._M_current + 1;
      }
      uVar17 = uVar17 + 1;
    } while (uVar17 < data->num_actions);
  }
  if (data->choices_lambda != 0) {
    uVar17 = 0;
    do {
      uVar5 = data->ws_train_size;
      uVar6 = data->inter_period;
      fVar4 = (data->lambdas).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start[uVar17];
      fVar19 = 1.0 - fVar4;
      if (ec_type != 1) {
        fVar19 = fVar4;
      }
      if (data->num_actions != 0) {
        uVar18 = 0;
        do {
          (data->ecs).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
          super__Vector_impl_data._M_start[uVar18]->weight =
               *(float *)((long)local_48 + uVar18 * 4) *
               ((((float)uVar5 + (float)uVar6) * fVar19) /
               ((1.0 - fVar4) * (float)uVar5 + fVar4 * (float)uVar6 + 1.1754944e-38));
          uVar18 = uVar18 + 1;
        } while (uVar18 < data->num_actions);
      }
      pmVar15 = LEARNER::as_multiline<char,char>(data->all->cost_sensitive);
      ppeVar16 = (data->ecs).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppeVar10 = (data->ecs).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      if (ppeVar16 != ppeVar10) {
        iVar7 = *(int *)(pmVar15 + 0xe0);
        do {
          puVar1 = &((*ppeVar16)->super_example_predict).ft_offset;
          *puVar1 = *puVar1 + (ulong)(uint)(iVar7 * (int)uVar17);
          ppeVar16 = ppeVar16 + 1;
        } while (ppeVar16 != ppeVar10);
      }
      (**(code **)(pmVar15 + 0x28))
                (*(undefined8 *)(pmVar15 + 0x18),*(undefined8 *)(pmVar15 + 0x20),&data->ecs);
      ppeVar16 = (data->ecs).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppeVar10 = (data->ecs).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      if (ppeVar16 != ppeVar10) {
        iVar7 = *(int *)(pmVar15 + 0xe0);
        do {
          puVar1 = &((*ppeVar16)->super_example_predict).ft_offset;
          *puVar1 = *puVar1 - (ulong)(uint)(iVar7 * (int)uVar17);
          ppeVar16 = ppeVar16 + 1;
        } while (ppeVar16 != ppeVar10);
      }
      uVar17 = uVar17 + 1;
    } while (uVar17 < data->choices_lambda);
  }
  if (data->num_actions != 0) {
    uVar17 = 0;
    do {
      (data->ecs).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
      super__Vector_impl_data._M_start[uVar17]->weight = *(float *)((long)local_48 + uVar17 * 4);
      uVar17 = uVar17 + 1;
    } while (uVar17 < data->num_actions);
  }
  if (data->num_actions != 0) {
    lVar14 = 0;
    uVar17 = 0;
    do {
      peVar9 = (data->ecs).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
               super__Vector_impl_data._M_start[uVar17];
      plVar2 = (label_t *)((long)&(data->cbls->costs)._begin + lVar14);
      lVar11 = *plVar2;
      lVar12 = plVar2[1];
      puVar3 = (undefined8 *)((long)&(data->cbls->costs).end_array + lVar14);
      sVar13 = puVar3[1];
      (peVar9->l).cs.costs.end_array = (wclass *)*puVar3;
      (peVar9->l).cs.costs.erase_count = sVar13;
      (peVar9->l).multi = lVar11;
      *(label_t *)&(peVar9->l).cs.costs._end = lVar12;
      uVar17 = uVar17 + 1;
      lVar14 = lVar14 + 0x20;
    } while (uVar17 < data->num_actions);
  }
  if (local_48 != (void *)0x0) {
    operator_delete(local_48);
  }
  return;
}

Assistant:

void learn_sup_adf(warm_cb& data, example& ec, int ec_type)
{
	copy_example_to_adf(data, ec);
	//generate cost-sensitive label (for cost-sensitive learner's temporary use)
	auto& csls = data.csls;
	auto& cbls = data.cbls;
	for (size_t a = 0; a < data.num_actions; ++a)
	{
		csls[a].costs[0].class_index = a+1;
		if (use_cs)
			csls[a].costs[0].x = loss_cs(data, ec.l.cs.costs, a+1);
 		else
			csls[a].costs[0].x = loss(data, ec.l.multi.label, a+1);
	}
	for (size_t a = 0; a < data.num_actions; ++a)
	{
		cbls[a] = data.ecs[a]->l.cb;
		data.ecs[a]->l.cs = csls[a];
	}

	vector<float> old_weights;
	for (size_t a = 0; a < data.num_actions; ++a)
		old_weights.push_back(data.ecs[a]->weight);

	for (uint32_t i = 0; i < data.choices_lambda; i++)
	{
		float weight_multiplier = compute_weight_multiplier(data, i, ec_type);
		for (size_t a = 0; a < data.num_actions; ++a)
			data.ecs[a]->weight = old_weights[a] * weight_multiplier;
		multi_learner* cs_learner = as_multiline(data.all->cost_sensitive);
		cs_learner->learn(data.ecs, i);
	}

	for (size_t a = 0; a < data.num_actions; ++a)
		data.ecs[a]->weight = old_weights[a];

	for (size_t a = 0; a < data.num_actions; ++a)
		data.ecs[a]->l.cb = cbls[a];
}